

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_protocol_test.cpp
# Opt level: O0

string * CreatePacketV0(string *user_data,size_t padding_size)

{
  unsigned_short value;
  undefined1 *puVar1;
  ulong uVar2;
  uchar *puVar3;
  unsigned_short in_DX;
  int local_4c;
  int i;
  PacketHeaderV0 *packet_header;
  char *ptr;
  size_t padding_size_local;
  string *user_data_local;
  string *result;
  
  std::__cxx11::string::string((string *)user_data);
  std::__cxx11::string::size();
  std::__cxx11::string::resize((ulong)user_data);
  puVar1 = (undefined1 *)std::__cxx11::string::data();
  packet_header = (PacketHeaderV0 *)(puVar1 + 0x1d);
  *puVar1 = 0x52;
  puVar1[1] = 0x4e;
  puVar1[2] = 0x36;
  puVar1[3] = 0x55;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  StoreBigEndian<unsigned_int>(0x3039,puVar1 + 9);
  StoreBigEndian<unsigned_int>(0xd431,puVar1 + 0xd);
  StoreBigEndian<unsigned_long>(0x499602d2,puVar1 + 0x11);
  value = std::__cxx11::string::size();
  StoreBigEndian<unsigned_short>(value,puVar1 + 0x19);
  StoreBigEndian<unsigned_short>(in_DX,puVar1 + 0x1b);
  for (local_4c = 0; uVar2 = std::__cxx11::string::size(), (ulong)(long)local_4c < uVar2;
      local_4c = local_4c + 1) {
    puVar3 = (uchar *)std::__cxx11::string::operator[](padding_size);
    packet_header->magic[0] = *puVar3;
    packet_header = (PacketHeaderV0 *)(packet_header->magic + 1);
  }
  return user_data;
}

Assistant:

std::string CreatePacketV0(const std::string& user_data, size_t padding_size) {
  std::string result;
  result.resize(sizeof(PacketHeaderV0) + user_data.size() + padding_size);

  char* ptr = const_cast<char*>(result.data());
  PacketHeaderV0* packet_header = (PacketHeaderV0*)ptr;
  ptr += sizeof(PacketHeaderV0);

  packet_header->magic[0] = 'R';
  packet_header->magic[1] = 'N';
  packet_header->magic[2] = '6';
  packet_header->magic[3] = 'U';
  packet_header->reserved[0] = 0;
  packet_header->reserved[1] = 0;
  packet_header->reserved[2] = 0;
  packet_header->reserved[3] = 0;
  packet_header->packet_type = udpdiscovery::kPacketIAmHere;
  StoreBigEndian<uint32_t>(kApplicationId, &packet_header->application_id);
  StoreBigEndian<uint32_t>(kPeerId, &packet_header->peer_id);
  StoreBigEndian<uint64_t>(kSnapshotIndex, &packet_header->packet_index);
  StoreBigEndian<uint16_t>(user_data.size(), &packet_header->user_data_size);
  StoreBigEndian<uint16_t>(padding_size, &packet_header->padding_size);

  for (int i = 0; i < user_data.size(); ++i) {
    *ptr = user_data[i];
    ++ptr;
  }

  return result;
}